

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerApp::OnEnergyReport
          (CommissionerApp *this,string *aPeerAddr,ChannelMask *aChannelMask,ByteArray *aEnergyList)

{
  bool bVar1;
  mapped_type *this_00;
  EnergyReport local_a8;
  ErrorCode local_78 [4];
  Error local_68;
  undefined1 local_40 [8];
  Address addr;
  ByteArray *aEnergyList_local;
  ChannelMask *aChannelMask_local;
  string *aPeerAddr_local;
  CommissionerApp *this_local;
  
  addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)aEnergyList;
  Address::Address((Address *)local_40);
  Address::Set(&local_68,(Address *)local_40,aPeerAddr);
  local_78[0] = kNone;
  bVar1 = commissioner::operator==(&local_68,local_78);
  Error::~Error(&local_68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::vector(&local_a8.mChannelMask,aChannelMask);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a8.mEnergyList,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
    this_00 = std::
              map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
              ::operator[](&this->mEnergyReports,(key_type *)local_40);
    EnergyReport::operator=(this_00,&local_a8);
    EnergyReport::~EnergyReport(&local_a8);
    Address::~Address((Address *)local_40);
    return;
  }
  abort();
}

Assistant:

void CommissionerApp::OnEnergyReport(const std::string &aPeerAddr,
                                     const ChannelMask &aChannelMask,
                                     const ByteArray   &aEnergyList)
{
    Address addr;

    SuccessOrDie(addr.Set(aPeerAddr));

    // FIXME(wgtdkp): synchronization
    mEnergyReports[addr] = {aChannelMask, aEnergyList};
}